

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufstream.c
# Opt level: O3

err_t BufWrite(bufstream *p,uint8_t *Data,size_t Size,size_t *Written)

{
  stream *psVar1;
  err_t eVar2;
  ulong __n;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  ulong local_38;
  
  if (Size == 0) {
    eVar2 = 0;
    sVar5 = 0;
  }
  else {
    sVar3 = p->WritePos;
    sVar5 = 0;
    sVar4 = Size;
    do {
      if (0xfff < sVar3) {
        eVar2 = BufFlush(p);
        if (eVar2 != 0) goto LAB_00121256;
        sVar3 = p->WritePos;
      }
      if ((sVar3 == 0) && (0x1000 < sVar4)) {
        psVar1 = p->Stream;
        local_38 = sVar4;
        if (psVar1 == (stream *)0x0) {
          __assert_fail("(const void*)(p->Stream)!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/file/bufstream.c"
                        ,0x6a,"err_t BufWrite(bufstream *, const uint8_t *, size_t, size_t *)");
        }
        eVar2 = (**(code **)((long)(psVar1->Base).VMT + 0x70))(psVar1,Data + sVar5,sVar4,&local_38);
        sVar5 = sVar5 + local_38;
        goto LAB_00121256;
      }
      __n = 0x1000 - sVar3;
      if (sVar4 < 0x1000 - sVar3) {
        __n = sVar4;
      }
      memcpy(p->Buffer + sVar3,Data + sVar5,__n);
      sVar5 = sVar5 + __n;
      sVar3 = __n + p->WritePos;
      p->WritePos = sVar3;
      sVar4 = Size - sVar5;
    } while (sVar4 != 0);
    eVar2 = 0;
    sVar5 = Size;
  }
LAB_00121256:
  if (Written != (size_t *)0x0) {
    *Written = sVar5;
  }
  return eVar2;
}

Assistant:

static err_t BufWrite(bufstream* p,const uint8_t* Data,size_t Size,size_t* Written)
{
    err_t Err = ERR_NONE;
    size_t Pos = 0;
    size_t Left;

    while ((Left = (Size - Pos)) > 0)
    {
        if (p->WritePos >= BUFSTREAM_SIZE && (Err = BufFlush(p)) != ERR_NONE)
            break;

        if (!p->WritePos && Left > BUFSTREAM_SIZE)
        {
            Err = Stream_Write(p->Stream,Data+Pos,Left,&Left);
            Pos += Left;
            break;
        }

        if (Left > BUFSTREAM_SIZE - p->WritePos)
            Left = BUFSTREAM_SIZE - p->WritePos;

        memcpy(p->Buffer+p->WritePos,Data+Pos,Left);
        Pos += Left;
        p->WritePos += Left;
    }

    if (Written)
        *Written = Pos;
    return Err;
}